

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O2

int compare_motions(void *arg_a,void *arg_b)

{
  if (*arg_a <= *arg_b) {
    if (*arg_a < *arg_b) {
      return 1;
    }
    if (*(double *)((long)arg_b + 8) <= *(double *)((long)arg_a + 8)) {
      return (int)(*(double *)((long)arg_b + 8) < *(double *)((long)arg_a + 8));
    }
  }
  return -1;
}

Assistant:

static int compare_motions(const void *arg_a, const void *arg_b) {
  const RANSAC_MOTION *motion_a = (RANSAC_MOTION *)arg_a;
  const RANSAC_MOTION *motion_b = (RANSAC_MOTION *)arg_b;

  if (motion_a->num_inliers > motion_b->num_inliers) return -1;
  if (motion_a->num_inliers < motion_b->num_inliers) return 1;
  if (motion_a->sse < motion_b->sse) return -1;
  if (motion_a->sse > motion_b->sse) return 1;
  return 0;
}